

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void anon_unknown.dwarf_acf0eb::ConvertUnit(DataType *dt,ConversionData *conv)

{
  undefined1 *puVar1;
  bool bVar2;
  ENTITY *this;
  IfcNamedUnit *pIVar3;
  IfcSIUnit *pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prefix;
  IfcConversionBasedUnit *pIVar5;
  IfcMeasureWithUnit *pIVar6;
  PrimitiveDataType<double> *pPVar7;
  IfcFloat IVar8;
  
  this = Assimp::STEP::EXPRESS::DataType::To<Assimp::STEP::EXPRESS::ENTITY>(dt);
  pIVar3 = Assimp::STEP::EXPRESS::DataType::ResolveSelect<Assimp::IFC::Schema_2x3::IfcNamedUnit>
                     ((DataType *)this,conv->db);
  puVar1 = &(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).field_0x18;
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          puVar1,"LENGTHUNIT");
  if ((bVar2) &&
     (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              puVar1,"PLANEANGLEUNIT"), bVar2)) {
    return;
  }
  pIVar4 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcSIUnit>
                     ((Object *)
                      ((long)&(pIVar3->
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                              _vptr_ObjectHelper +
                      (long)(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>)
                            ._vptr_ObjectHelper[-3]));
  if (pIVar4 == (IfcSIUnit *)0x0) {
    pIVar5 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcConversionBasedUnit>
                       ((Object *)
                        ((long)&(pIVar3->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                                _vptr_ObjectHelper +
                        (long)(pIVar3->
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                              _vptr_ObjectHelper[-3]));
    if ((pIVar5 != (IfcConversionBasedUnit *)0x0) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&(pIVar5->super_IfcNamedUnit).
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
                                  field_0x18,"PLANEANGLEUNIT"), bVar2)) {
      pIVar6 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit>::operator->
                         (&pIVar5->ConversionFactor);
      pPVar7 = Assimp::STEP::EXPRESS::DataType::To<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>
                         (*(DataType **)
                           &(pIVar6->
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
                            field_0x10);
      conv->angle_scale = pPVar7->val;
      pIVar6 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit>::operator->
                         (&pIVar5->ConversionFactor);
      ConvertUnit(*(DataType **)
                   &(pIVar6->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMeasureWithUnit,_2UL>).
                    field_0x20,conv);
      Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x482834);
    }
  }
  else {
    puVar1 = &(pIVar4->super_IfcNamedUnit).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x18;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            puVar1,"LENGTHUNIT");
    if (bVar2) {
      if (pIVar4->field_0x68 == '\x01') {
        prefix = Assimp::STEP::
                 Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&(pIVar4->super_IfcNamedUnit).field_0x48);
        IVar8 = Assimp::IFC::ConvertSIPrefix(prefix);
      }
      else {
        IVar8 = 1.0;
      }
      conv->len_scale = IVar8;
      Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x48284e);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            puVar1,"PLANEANGLEUNIT");
    if ((bVar2) && (bVar2 = std::operator!=(&pIVar4->Name,"RADIAN"), bVar2)) {
      Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x482884);
    }
  }
  return;
}

Assistant:

void ConvertUnit(const ::Assimp::STEP::EXPRESS::DataType& dt,ConversionData& conv)
{
    try {
        const ::Assimp::STEP::EXPRESS::ENTITY& e = dt.To<::Assimp::STEP::EXPRESS::ENTITY>();

        const Schema_2x3::IfcNamedUnit& unit = e.ResolveSelect<Schema_2x3::IfcNamedUnit>(conv.db);
        if(unit.UnitType != "LENGTHUNIT" && unit.UnitType != "PLANEANGLEUNIT") {
            return;
        }

        ConvertUnit(unit,conv);
    }
    catch(std::bad_cast&) {
        // not entity, somehow
        IFCImporter::LogError("skipping unknown IfcUnit entry - expected entity");
    }
}